

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

NanoVDBMediumProvider *
pbrt::NanoVDBMediumProvider::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  NanoVDBMediumProvider *pNVar4;
  Float temperatureCutoff;
  Float temperatureScale;
  GridHandle<pbrt::NanoVDBBuffer> temperatureGrid;
  GridHandle<pbrt::NanoVDBBuffer> densityGrid;
  Float LeScale;
  Bounds3f bounds;
  string filename;
  allocator<char> local_11d;
  Float local_11c;
  undefined1 local_118 [8];
  NanoVDBBuffer local_110;
  Float local_f8;
  undefined4 uStack_f4;
  undefined8 uStack_f0;
  Float local_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  Tuple3<pbrt::Point3,_float> local_a0;
  double local_90;
  double local_88;
  string local_80;
  polymorphic_allocator<std::byte> local_60;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_60.memoryResource = alloc.memoryResource;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"filename",(allocator<char> *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"",(allocator<char> *)&local_80);
  ParameterDictionary::GetOneString(&local_58,parameters,(string *)local_c0,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_c0);
  if (local_58._M_string_length == 0) {
    ErrorExit(loc,"Must supply \"filename\" to \"nanovdb\" medium.");
  }
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle((GridHandle<pbrt::NanoVDBBuffer> *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"density",(allocator<char> *)&local_80);
  readGrid<pbrt::NanoVDBBuffer>
            ((GridHandle<pbrt::NanoVDBBuffer> *)local_e0,&local_58,(string *)local_118,loc,alloc);
  NanoVDBBuffer::operator=((NanoVDBBuffer *)(local_c0 + 8),(NanoVDBBuffer *)(local_e0 + 8));
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle((GridHandle<pbrt::NanoVDBBuffer> *)local_e0)
  ;
  std::__cxx11::string::~string((string *)local_118);
  lVar3 = (**(code **)(local_c0._0_8_ + 0x10))(local_c0);
  if (lVar3 != 0) {
    lVar3 = 0;
    if (*(int *)(local_c0._24_8_ + 0x24c) == 1) {
      lVar3 = local_c0._24_8_;
    }
    local_90 = *(double *)(lVar3 + 0x118);
    local_38 = *(undefined8 *)(lVar3 + 0x108);
    uStack_30 = *(undefined8 *)(lVar3 + 0x110);
    uStack_f0 = *(undefined8 *)(lVar3 + 0x128);
    local_88 = *(double *)(lVar3 + 0x130);
    local_f8 = (Float)*(undefined8 *)(lVar3 + 0x120);
    uStack_f4 = (undefined4)((ulong)*(undefined8 *)(lVar3 + 0x120) >> 0x20);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"temperature",(allocator<char> *)&local_a0);
    readGrid<pbrt::NanoVDBBuffer>
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_118,&local_58,&local_80,loc,alloc);
    NanoVDBBuffer::operator=((NanoVDBBuffer *)(local_e0 + 8),&local_110);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_118);
    std::__cxx11::string::~string((string *)&local_80);
    auVar2._8_8_ = uStack_30;
    auVar2._0_8_ = local_38;
    auVar1 = vcvtpd2ps_avx(auVar2);
    local_110.alloc.memoryResource._0_4_ = (float)local_90;
    local_118 = (undefined1  [8])vmovlps_avx(auVar1);
    auVar1._4_4_ = uStack_f4;
    auVar1._0_4_ = local_f8;
    auVar1._8_8_ = uStack_f0;
    auVar1 = vcvtpd2ps_avx(auVar1);
    local_a0.z = (float)local_88;
    local_a0._0_8_ = vmovlps_avx(auVar1);
    Bounds3<float>::Bounds3
              ((Bounds3<float> *)&local_80,(Point3<float> *)local_118,(Point3<float> *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"LeScale",(allocator<char> *)&local_11c);
    local_f8 = ParameterDictionary::GetOneFloat(parameters,(string *)local_118,1.0);
    std::__cxx11::string::~string((string *)local_118);
    local_a0.x = local_f8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"temperaturecutoff",(allocator<char> *)&local_e4);
    local_f8 = ParameterDictionary::GetOneFloat(parameters,(string *)local_118,0.0);
    std::__cxx11::string::~string((string *)local_118);
    local_11c = local_f8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"temperaturescale",&local_11d);
    local_f8 = ParameterDictionary::GetOneFloat(parameters,(string *)local_118,1.0);
    std::__cxx11::string::~string((string *)local_118);
    local_e4 = local_f8;
    pNVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::NanoVDBMediumProvider,pbrt::Bounds3<float>&,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,float&,float&,float&>
                       (&local_60,(Bounds3<float> *)&local_80,
                        (GridHandle<pbrt::NanoVDBBuffer> *)local_c0,
                        (GridHandle<pbrt::NanoVDBBuffer> *)local_e0,&local_a0.x,&local_11c,
                        (float *)&local_e4);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_e0);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_c0);
    std::__cxx11::string::~string((string *)&local_58);
    return pNVar4;
  }
  ErrorExit<std::__cxx11::string&>(loc,"%s: didn\'t find \"density\" grid.",&local_58);
}

Assistant:

NanoVDBMediumProvider *NanoVDBMediumProvider::Create(
    const ParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    std::string filename = parameters.GetOneString("filename", "");
    if (filename.empty())
        ErrorExit(loc, "Must supply \"filename\" to \"nanovdb\" medium.");

    nanovdb::GridHandle<NanoVDBBuffer> densityGrid;
    nanovdb::BBox<nanovdb::Vec3R> bbox;
    densityGrid = readGrid<NanoVDBBuffer>(filename, "density", loc, alloc);
    if (!densityGrid)
        ErrorExit(loc, "%s: didn't find \"density\" grid.", filename);

    bbox = densityGrid.grid<float>()->worldBBox();

    nanovdb::GridHandle<NanoVDBBuffer> temperatureGrid;
    temperatureGrid = readGrid<NanoVDBBuffer>(filename, "temperature", loc, alloc);

    Bounds3f bounds(Point3f(bbox.min()[0], bbox.min()[1], bbox.min()[2]),
                    Point3f(bbox.max()[0], bbox.max()[1], bbox.max()[2]));

    Float LeScale = parameters.GetOneFloat("LeScale", 1.f);
    Float temperatureCutoff = parameters.GetOneFloat("temperaturecutoff", 0.f);
    Float temperatureScale = parameters.GetOneFloat("temperaturescale", 1.f);

    return alloc.new_object<NanoVDBMediumProvider>(bounds, std::move(densityGrid),
                                                   std::move(temperatureGrid), LeScale,
                                                   temperatureCutoff, temperatureScale);
}